

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bassigncstr(bstring a,char *str)

{
  ulong __n;
  uchar uVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  iVar4 = -1;
  if ((((a != (bstring)0x0) && (a->data != (uchar *)0x0)) &&
      (iVar2 = a->mlen, -1 < a->slen && a->slen <= iVar2)) && (str != (char *)0x0 && iVar2 != 0)) {
    for (uVar6 = 0; iVar5 = (int)uVar6, (long)uVar6 < (long)iVar2; uVar6 = uVar6 + 1) {
      uVar1 = str[uVar6];
      a->data[uVar6] = uVar1;
      if (uVar1 == '\0') goto LAB_001451b6;
      iVar2 = a->mlen;
    }
    a->slen = iVar5;
    sVar3 = strlen(str + uVar6);
    __n = sVar3 + 1;
    if (__n <= (uVar6 ^ 0x7fffffff)) {
      iVar2 = balloc(a,(int)sVar3 + iVar5 + 1);
      if (-1 < iVar2) {
        if (__n != 0) {
          memmove(a->data + uVar6,str + uVar6,__n);
        }
        iVar5 = (int)sVar3 + a->slen;
LAB_001451b6:
        a->slen = iVar5;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int bassigncstr (bstring a, const char * str) {
int i;
size_t len;
	if (a == NULL || a->data == NULL || a->mlen < a->slen ||
	    a->slen < 0 || a->mlen == 0 || NULL == str)
		return BSTR_ERR;

	for (i=0; i < a->mlen; i++) {
		if ('\0' == (a->data[i] = str[i])) {
			a->slen = i;
			return BSTR_OK;
		}
	}

	a->slen = i;
	len = strlen (str + i);
	if (len + 1 > (size_t) INT_MAX - i ||
	    0 > balloc (a, (int) (i + len + 1))) return BSTR_ERR;
	bBlockCopy (a->data + i, str + i, (size_t) len + 1);
	a->slen += (int) len;
	return BSTR_OK;
}